

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&>::MatchAndExplain
          (ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&> *this,
          array<unsigned_long,_5UL> *container,MatchResultListener *listener)

{
  unsigned_long *x;
  ostream *poVar1;
  pointer pMVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  MatchResultListener *pMVar5;
  size_t sVar6;
  size_t count;
  bool bVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 local_228 [8];
  StringMatchResultListener s;
  long local_80 [2];
  undefined1 local_70 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  
  poVar1 = listener->stream_;
  explanations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)container;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_228);
  lVar9 = 0;
  lVar10 = 0;
  lVar8 = 0;
  sVar6 = 0;
  do {
    bVar7 = false;
    pMVar2 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (sVar6 == ((long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
                 -0x5555555555555555) goto LAB_0016e2ce;
    x = (unsigned_long *)
        ((long)&((explanations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)._M_p + lVar8);
    if (poVar1 == (ostream *)0x0) {
      s.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)0x0;
      local_228 = (undefined1  [8])&PTR__MatchResultListener_00203a38;
      bVar4 = MatcherBase<const_unsigned_long_&>::MatchAndExplain
                        ((MatcherBase<const_unsigned_long_&> *)
                         ((long)&(pMVar2->super_MatcherBase<const_unsigned_long_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         lVar10),x,(MatchResultListener *)local_228);
    }
    else {
      s.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)&s.field_0x18;
      local_228 = (undefined1  [8])&PTR__StringMatchResultListener_00203b60;
      std::__cxx11::stringstream::stringstream((stringstream *)&s.super_MatchResultListener.stream_)
      ;
      bVar4 = MatcherBase<const_unsigned_long_&>::MatchAndExplain
                        ((MatcherBase<const_unsigned_long_&> *)
                         ((long)&(((this->matchers_).
                                   super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_MatcherBase<const_unsigned_long_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         lVar10),x,(MatchResultListener *)local_228);
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((_Alloc_hider *)local_70)->_M_p + lVar9),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s.field_0x190
                );
      if ((long *)s._400_8_ != local_80) {
        operator_delete((void *)s._400_8_,local_80[0] + 1);
      }
      local_228 = (undefined1  [8])&PTR__StringMatchResultListener_00203b60;
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)&s.super_MatchResultListener.stream_);
      std::ios_base::~ios_base((ios_base *)&s.field_0x88);
    }
    bVar7 = false;
    if (bVar4 == false) {
      bVar7 = true;
      goto LAB_0016e2ce;
    }
    lVar8 = lVar8 + 8;
    sVar6 = sVar6 + 1;
    lVar10 = lVar10 + 0x18;
    lVar9 = lVar9 + 0x20;
  } while (lVar8 != 0x28);
  lVar8 = 0x28;
  sVar6 = 5;
LAB_0016e2ce:
  count = sVar6 + 1 + (0x20U - lVar8 >> 3);
  if (lVar8 == 0x28) {
    count = sVar6;
  }
  if (count == ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    if (!bVar7) {
      bVar7 = true;
      if ((poVar1 != (ostream *)0x0) &&
         ((this->matchers_).
          super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        lVar9 = 8;
        bVar4 = false;
        lVar8 = 0;
        do {
          auVar3 = local_70;
          if (*(long *)((long)&((_Alloc_hider *)local_70)->_M_p + lVar9) != 0) {
            if (bVar4) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
            }
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            bVar4 = true;
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar5->stream_,*(char **)((long)auVar3 + lVar9 + -8),
                         *(long *)((long)&((_Alloc_hider *)auVar3)->_M_p + lVar9));
            }
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x20;
        } while (lVar8 != ((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555);
      }
      goto LAB_0016e404;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar5->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
      }
      MatchResultListener::operator<<(pMVar5,(char (*) [15])" doesn\'t match");
      poVar1 = listener->stream_;
      bVar7 = false;
      if ((poVar1 == (ostream *)0x0) ||
         (bVar7 = false, ((pointer)((long)local_70 + sVar6 * 0x20))->_M_string_length == 0))
      goto LAB_0016e404;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(((pointer)((long)local_70 + sVar6 * 0x20))->_M_dataplus)._M_p,
                 ((pointer)((long)local_70 + sVar6 * 0x20))->_M_string_length);
    }
  }
  else {
    bVar7 = false;
    if ((poVar1 == (ostream *)0x0) || (count == 0)) goto LAB_0016e404;
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&> *)local_228,count);
    MatchResultListener::operator<<(pMVar5,(Message *)local_228);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_228 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_228 + 8))();
    }
  }
  bVar7 = false;
LAB_0016e404:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_70);
  return bVar7;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }